

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConnection.cpp
# Opt level: O0

void __thiscall
FIX::HttpConnection::processResetSession
          (HttpConnection *this,HttpMessage *request,stringstream *h,stringstream *b)

{
  bool bVar1;
  string *psVar2;
  SessionNotFound *this_00;
  ostream *poVar3;
  TAG *pTVar4;
  bool local_153a;
  exception *e;
  A a_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12d0;
  undefined1 local_12b0 [8];
  A a_2;
  CENTER center_2;
  string local_f20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f00;
  undefined1 local_ee0 [8];
  A a_1;
  H2 h2_1;
  CENTER center_1;
  string local_998;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_978;
  undefined1 local_958 [8];
  A a;
  H2 h2;
  CENTER center;
  allocator<char> local_409;
  string local_408;
  byte local_3e3;
  byte local_3e2;
  allocator<char> local_3e1;
  string local_3e0;
  allocator<char> local_3b9;
  string local_3b8;
  byte local_391;
  undefined1 local_390 [7];
  bool confirm;
  undefined1 local_370 [8];
  string sessionUrl;
  string local_348;
  Session *local_328;
  Session *pSession;
  SessionID sessionID;
  string local_1c8;
  allocator<char> local_1a1;
  string local_1a0;
  undefined1 local_180 [8];
  string sessionQualifier;
  string local_158;
  undefined1 local_138 [8];
  string targetCompID;
  string local_110;
  undefined1 local_f0 [8];
  string senderCompID;
  string local_c8;
  undefined1 local_a8 [8];
  string beginString;
  undefined1 local_78 [8];
  HttpMessage copy;
  stringstream *b_local;
  stringstream *h_local;
  HttpMessage *request_local;
  HttpConnection *this_local;
  
  copy.m_parameters._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)b;
  HttpMessage::HttpMessage((HttpMessage *)local_78,request);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"BeginString",
             (allocator<char> *)(senderCompID.field_2._M_local_buf + 0xf));
  psVar2 = HttpMessage::getParameter(request,&local_c8);
  std::__cxx11::string::string((string *)local_a8,(string *)psVar2);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator((allocator<char> *)(senderCompID.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"SenderCompID",
             (allocator<char> *)(targetCompID.field_2._M_local_buf + 0xf));
  psVar2 = HttpMessage::getParameter(request,&local_110);
  std::__cxx11::string::string((string *)local_f0,(string *)psVar2);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator((allocator<char> *)(targetCompID.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"TargetCompID",
             (allocator<char> *)(sessionQualifier.field_2._M_local_buf + 0xf));
  psVar2 = HttpMessage::getParameter(request,&local_158);
  std::__cxx11::string::string((string *)local_138,(string *)psVar2);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator((allocator<char> *)(sessionQualifier.field_2._M_local_buf + 0xf))
  ;
  std::__cxx11::string::string((string *)local_180);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,"SessionQualifier",&local_1a1);
  bVar1 = HttpMessage::hasParameter((HttpMessage *)local_78,&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator(&local_1a1);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,"SessionQualifier",
               (allocator<char> *)(sessionID.m_frozenString.field_2._M_local_buf + 0xf));
    psVar2 = HttpMessage::getParameter((HttpMessage *)local_78,&local_1c8);
    std::__cxx11::string::operator=((string *)local_180,(string *)psVar2);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::allocator<char>::~allocator
              ((allocator<char> *)(sessionID.m_frozenString.field_2._M_local_buf + 0xf));
  }
  SessionID::SessionID
            ((SessionID *)&pSession,(string *)local_a8,(string *)local_f0,(string *)local_138,
             (string *)local_180);
  local_328 = Session::lookupSession((SessionID *)&pSession);
  if (local_328 != (Session *)0x0) {
    HttpMessage::getParameterString_abi_cxx11_((string *)local_390,request);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_370,
                   "/session",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_390);
    std::__cxx11::string::~string((string *)local_390);
    local_391 = 0;
    std::allocator<char>::allocator();
    local_3e2 = 0;
    local_3e3 = 0;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b8,"confirm",&local_3b9);
    bVar1 = HttpMessage::hasParameter((HttpMessage *)local_78,&local_3b8);
    local_153a = false;
    if (bVar1) {
      std::allocator<char>::allocator();
      local_3e2 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e0,"confirm",&local_3e1);
      local_3e3 = 1;
      psVar2 = HttpMessage::getParameter((HttpMessage *)local_78,&local_3e0);
      local_153a = std::operator!=(psVar2,"0");
    }
    if ((local_3e3 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_3e0);
    }
    if ((local_3e2 & 1) != 0) {
      std::allocator<char>::~allocator(&local_3e1);
    }
    std::__cxx11::string::~string((string *)&local_3b8);
    std::allocator<char>::~allocator(&local_3b9);
    if (local_153a != false) {
      local_391 = 1;
      Session::reset(local_328);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_408,"confirm",&local_409);
      HttpMessage::removeParameter((HttpMessage *)local_78,&local_408);
      std::__cxx11::string::~string((string *)&local_408);
      std::allocator<char>::~allocator(&local_409);
    }
    if ((local_391 & 1) == 0) {
      HTML::CENTER::CENTER
                ((CENTER *)&h2_1.super_TAG.m_stream,
                 (ostream *)
                 (copy.m_parameters._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x10));
      HTML::TAG::text((TAG *)&h2_1.super_TAG.m_stream);
      HTML::H2::H2((H2 *)&a_1.super_TAG.m_stream,
                   (ostream *)
                   (copy.m_parameters._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x10));
      HTML::TAG::text((TAG *)&a_1.super_TAG.m_stream);
      std::operator<<((ostream *)
                      (copy.m_parameters._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x10),
                      "Are you sure you want to reset session ");
      HTML::A::A((A *)local_ee0,
                 (ostream *)
                 (copy.m_parameters._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x10));
      HttpMessage::getParameterString_abi_cxx11_(&local_f20,request);
      std::operator+(&local_f00,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_370,
                     &local_f20);
      pTVar4 = &HTML::A::href((A *)local_ee0,&local_f00)->super_TAG;
      SessionID::toString_abi_cxx11_((string *)&center_2.super_TAG.m_stream,(SessionID *)&pSession);
      HTML::TAG::text<std::__cxx11::string>
                (pTVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &center_2.super_TAG.m_stream);
      std::__cxx11::string::~string((string *)&center_2.super_TAG.m_stream);
      std::__cxx11::string::~string((string *)&local_f00);
      std::__cxx11::string::~string((string *)&local_f20);
      HTML::A::~A((A *)local_ee0);
      std::operator<<((ostream *)
                      (copy.m_parameters._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x10),
                      "?");
      HTML::H2::~H2((H2 *)&a_1.super_TAG.m_stream);
      HTML::CENTER::~CENTER((CENTER *)&h2_1.super_TAG.m_stream);
      HTML::CENTER::CENTER
                ((CENTER *)&a_2.super_TAG.m_stream,
                 (ostream *)
                 (copy.m_parameters._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x10));
      HTML::TAG::text((TAG *)&a_2.super_TAG.m_stream);
      std::operator<<((ostream *)
                      (copy.m_parameters._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x10),
                      "[");
      HTML::A::A((A *)local_12b0,
                 (ostream *)
                 (copy.m_parameters._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x10));
      HttpMessage::toString_abi_cxx11_((string *)&a_3.super_TAG.m_stream,request);
      std::operator+(&local_12d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &a_3.super_TAG.m_stream,"&confirm=1");
      pTVar4 = &HTML::A::href((A *)local_12b0,&local_12d0)->super_TAG;
      HTML::TAG::text<char[19]>(pTVar4,(char (*) [19])"YES, reset session");
      std::__cxx11::string::~string((string *)&local_12d0);
      std::__cxx11::string::~string((string *)&a_3.super_TAG.m_stream);
      HTML::A::~A((A *)local_12b0);
      poVar3 = std::operator<<((ostream *)
                               (copy.m_parameters._M_t._M_impl.super__Rb_tree_header._M_node_count +
                               0x10),"]");
      poVar3 = std::operator<<(poVar3,HTML::NBSP);
      std::operator<<(poVar3,"[");
      HTML::A::A((A *)&e,(ostream *)
                         (copy.m_parameters._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x10)
                );
      pTVar4 = &HTML::A::href((A *)&e,(string *)local_370)->super_TAG;
      HTML::TAG::text<char[25]>(pTVar4,(char (*) [25])"NO, do not reset session");
      HTML::A::~A((A *)&e);
      std::operator<<((ostream *)
                      (copy.m_parameters._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x10),
                      "]");
      HTML::CENTER::~CENTER((CENTER *)&a_2.super_TAG.m_stream);
    }
    else {
      poVar3 = std::operator<<((ostream *)(h + 0x10),"<META http-equiv=\'refresh\' content=2;URL=\'"
                              );
      poVar3 = std::operator<<(poVar3,"/session");
      HttpMessage::getParameterString_abi_cxx11_
                ((string *)&center.super_TAG.m_stream,(HttpMessage *)local_78);
      poVar3 = std::operator<<(poVar3,(string *)&center.super_TAG.m_stream);
      std::operator<<(poVar3,"\'>");
      std::__cxx11::string::~string((string *)&center.super_TAG.m_stream);
      HTML::CENTER::CENTER
                ((CENTER *)&h2.super_TAG.m_stream,
                 (ostream *)
                 (copy.m_parameters._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x10));
      HTML::TAG::text((TAG *)&h2.super_TAG.m_stream);
      HTML::H2::H2((H2 *)&a.super_TAG.m_stream,
                   (ostream *)
                   (copy.m_parameters._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x10));
      HTML::TAG::text((TAG *)&a.super_TAG.m_stream);
      HTML::A::A((A *)local_958,
                 (ostream *)
                 (copy.m_parameters._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x10));
      HttpMessage::getParameterString_abi_cxx11_(&local_998,(HttpMessage *)local_78);
      std::operator+(&local_978,"/session",&local_998);
      pTVar4 = &HTML::A::href((A *)local_958,&local_978)->super_TAG;
      SessionID::toString_abi_cxx11_((string *)&center_1.super_TAG.m_stream,(SessionID *)&pSession);
      HTML::TAG::text<std::__cxx11::string>
                (pTVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &center_1.super_TAG.m_stream);
      std::__cxx11::string::~string((string *)&center_1.super_TAG.m_stream);
      std::__cxx11::string::~string((string *)&local_978);
      std::__cxx11::string::~string((string *)&local_998);
      HTML::A::~A((A *)local_958);
      std::operator<<((ostream *)
                      (copy.m_parameters._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x10),
                      " has been reset");
      HTML::H2::~H2((H2 *)&a.super_TAG.m_stream);
      HTML::CENTER::~CENTER((CENTER *)&h2.super_TAG.m_stream);
    }
    std::__cxx11::string::~string((string *)local_370);
    SessionID::~SessionID((SessionID *)&pSession);
    std::__cxx11::string::~string((string *)local_180);
    std::__cxx11::string::~string((string *)local_138);
    std::__cxx11::string::~string((string *)local_f0);
    std::__cxx11::string::~string((string *)local_a8);
    HttpMessage::~HttpMessage((HttpMessage *)local_78);
    return;
  }
  sessionUrl.field_2._M_local_buf[0xe] = '\x01';
  this_00 = (SessionNotFound *)__cxa_allocate_exception(0x50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"",(allocator<char> *)(sessionUrl.field_2._M_local_buf + 0xf));
  SessionNotFound::SessionNotFound(this_00,&local_348);
  sessionUrl.field_2._M_local_buf[0xe] = '\0';
  __cxa_throw(this_00,&SessionNotFound::typeinfo,SessionNotFound::~SessionNotFound);
}

Assistant:

void HttpConnection::processResetSession(const HttpMessage &request, std::stringstream &h, std::stringstream &b) {
  try {
    HttpMessage copy = request;
    std::string beginString = request.getParameter("BeginString");
    std::string senderCompID = request.getParameter("SenderCompID");
    std::string targetCompID = request.getParameter("TargetCompID");
    std::string sessionQualifier;
    if (copy.hasParameter("SessionQualifier")) {
      sessionQualifier = copy.getParameter("SessionQualifier");
    }

    SessionID sessionID(beginString, senderCompID, targetCompID, sessionQualifier);
    Session *pSession = Session::lookupSession(sessionID);
    if (pSession == 0) {
      throw SessionNotFound();
    }

    std::string sessionUrl = "/session" + request.getParameterString();

    bool confirm = false;
    if (copy.hasParameter("confirm") && copy.getParameter("confirm") != "0") {
      confirm = true;
      pSession->reset();
      copy.removeParameter("confirm");
    }

    if (confirm) {
      h << "<META http-equiv='refresh' content=2;URL='" << "/session" << copy.getParameterString() << "'>";
      CENTER center(b);
      center.text();
      H2 h2(b);
      h2.text();
      {
        A a(b);
        a.href("/session" + copy.getParameterString()).text(sessionID.toString());
      }
      b << " has been reset";
    } else {
      {
        CENTER center(b);
        center.text();
        H2 h2(b);
        h2.text();
        b << "Are you sure you want to reset session ";
        {
          A a(b);
          a.href(sessionUrl + request.getParameterString()).text(sessionID.toString());
        }
        b << "?";
      }
      {
        CENTER center(b);
        center.text();
        b << "[";
        {
          A a(b);
          a.href(request.toString() + "&confirm=1").text("YES, reset session");
        }
        b << "]" << NBSP << "[";
        {
          A a(b);
          a.href(sessionUrl).text("NO, do not reset session");
        }
        b << "]";
      }
    }
  } catch (std::exception &e) {
    b << e.what();
  }
}